

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpanTests.cpp
# Opt level: O1

int testSpanTestsSlicingUnboundedEdge(void)

{
  reference piVar1;
  ostream *poVar2;
  int iVar3;
  initializer_list<int> __l;
  Span<int,_18446744073709551615UL> sub;
  vector<int,_std::allocator<int>_> values;
  Span<int,_18446744073709551615UL> span;
  Span<int,_18446744073709551615UL> local_48;
  vector<int,_std::allocator<int>_> local_38;
  Span<int,_18446744073709551615UL> local_20;
  
  local_20.m_ptr = (pointer)0x200000001;
  local_20.m_size.m_size = 0x400000003;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_20;
  std::vector<int,_std::allocator<int>_>::vector(&local_38,__l,(allocator_type *)&local_48);
  local_20.m_ptr = (pointer)0x0;
  if ((long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != 0) {
    local_20.m_ptr =
         local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start;
  }
  local_20.m_size.m_size =
       (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start >> 2;
  local_48 = MILBlob::Util::Span<int,_18446744073709551615UL>::Slice(&local_20,3);
  if (local_48.m_size.m_size.m_size == 1) {
    iVar3 = 0;
    piVar1 = MILBlob::Util::Span<int,_18446744073709551615UL>::operator[](&local_48,0);
    if (*piVar1 == 4) goto LAB_001ccf25;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
               ,0x71);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1e3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"(sub[0]) == (4)",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
               ,0x71);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1e2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"(sub.Size()) == (size_t(1))",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  }
  std::ostream::put((char)poVar2);
  iVar3 = 1;
  std::ostream::flush();
LAB_001ccf25:
  if (local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return iVar3;
}

Assistant:

int testSpanTestsSlicingUnboundedEdge()
{
    std::vector<int> values = {1, 2, 3, 4};
    auto span = MakeSpan(values);

    auto sub = span.Slice(3);
    ML_ASSERT_EQ(sub.Size(), size_t(1));
    ML_ASSERT_EQ(sub[0], 4);

    return 0;
}